

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::WasmByteCodeWriter::TryWriteWasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot value,uint32 slotIndex,uint32 offset,
          ViewType viewType)

{
  Data *this_00;
  uint32 local_21;
  undefined2 local_1d;
  undefined2 local_1b;
  OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if (((DAT_0159efbd == '\0') && (local_1b = (undefined2)value, value < 0x10000)) &&
     (local_1d = (undefined2)slotIndex, slotIndex < 0x10000)) {
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    local_21 = offset;
    layout.Offset._0_1_ = viewType;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>(this_00,op,&this->super_ByteCodeWriter,false);
    ByteCodeWriter::Data::Write(this_00,&local_21,9);
    return true;
  }
  return false;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteWasmMemAccess(OpCodeAsmJs op, RegSlot value, uint32 slotIndex, uint32 offset, ArrayBufferView::ViewType viewType)
    {
        OpLayoutT_WasmMemAccess<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::template Assign<ArrayBufferView::ViewType>(layout.ViewType, viewType)
            && SizePolicy::Assign(layout.SlotIndex, slotIndex)
            && SizePolicy::Assign(layout.Offset, offset))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }